

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O0

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapTypedArrayInfo(SnapObject *snpObject,InflateMap *inflator)

{
  ScriptContext *this;
  SnapTypedArrayInfo *pSVar1;
  JavascriptLibrary *javascriptLibrary;
  RecyclableObject *pRVar2;
  ArrayBuffer *arrayBuffer_00;
  Var local_40;
  Var tab;
  ArrayBuffer *arrayBuffer;
  JavascriptLibrary *jslib;
  SnapTypedArrayInfo *typedArrayInfo;
  ScriptContext *ctx;
  InflateMap *inflator_local;
  SnapObject *snpObject_local;
  
  this = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  pSVar1 = SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapTypedArrayInfo*,(TTD::NSSnapObjects::SnapObjectType)24>
                     (snpObject);
  javascriptLibrary = Js::ScriptContext::GetLibrary(this);
  pRVar2 = InflateMap::LookupObject(inflator,pSVar1->ArrayBufferAddr);
  arrayBuffer_00 = Js::VarTo<Js::ArrayBuffer,Js::RecyclableObject>(pRVar2);
  switch(snpObject->SnapType->JsTypeId) {
  case TypeIds_Int8Array:
    local_40 = Js::TypedArray<char,_false,_false>::Create
                         (&arrayBuffer_00->super_ArrayBufferBase,pSVar1->ByteOffset,pSVar1->Length,
                          javascriptLibrary);
    break;
  case TypeIds_Uint8Array:
    local_40 = Js::TypedArray<unsigned_char,_false,_false>::Create
                         (&arrayBuffer_00->super_ArrayBufferBase,pSVar1->ByteOffset,pSVar1->Length,
                          javascriptLibrary);
    break;
  case TypeIds_Uint8ClampedArray:
    local_40 = Js::TypedArray<unsigned_char,_true,_false>::Create
                         (&arrayBuffer_00->super_ArrayBufferBase,pSVar1->ByteOffset,pSVar1->Length,
                          javascriptLibrary);
    break;
  case TypeIds_Int16Array:
    local_40 = Js::TypedArray<short,_false,_false>::Create
                         (&arrayBuffer_00->super_ArrayBufferBase,pSVar1->ByteOffset,pSVar1->Length,
                          javascriptLibrary);
    break;
  case TypeIds_Uint16Array:
    local_40 = Js::TypedArray<unsigned_short,_false,_false>::Create
                         (&arrayBuffer_00->super_ArrayBufferBase,pSVar1->ByteOffset,pSVar1->Length,
                          javascriptLibrary);
    break;
  case TypeIds_Int32Array:
    local_40 = Js::TypedArray<int,_false,_false>::Create
                         (&arrayBuffer_00->super_ArrayBufferBase,pSVar1->ByteOffset,pSVar1->Length,
                          javascriptLibrary);
    break;
  case TypeIds_Uint32Array:
    local_40 = Js::TypedArray<unsigned_int,_false,_false>::Create
                         (&arrayBuffer_00->super_ArrayBufferBase,pSVar1->ByteOffset,pSVar1->Length,
                          javascriptLibrary);
    break;
  case TypeIds_Float32Array:
    local_40 = Js::TypedArray<float,_false,_false>::Create
                         (&arrayBuffer_00->super_ArrayBufferBase,pSVar1->ByteOffset,pSVar1->Length,
                          javascriptLibrary);
    break;
  case TypeIds_Float64Array:
    local_40 = Js::TypedArray<double,_false,_false>::Create
                         (&arrayBuffer_00->super_ArrayBufferBase,pSVar1->ByteOffset,pSVar1->Length,
                          javascriptLibrary);
    break;
  case TypeIds_Int64Array:
    local_40 = Js::TypedArray<long,_false,_false>::Create
                         (&arrayBuffer_00->super_ArrayBufferBase,pSVar1->ByteOffset,pSVar1->Length,
                          javascriptLibrary);
    break;
  case TypeIds_Uint64Array:
    local_40 = Js::TypedArray<unsigned_long,_false,_false>::Create
                         (&arrayBuffer_00->super_ArrayBufferBase,pSVar1->ByteOffset,pSVar1->Length,
                          javascriptLibrary);
    break;
  case TypeIds_CharArray:
    local_40 = Js::CharArray::Create
                         (&arrayBuffer_00->super_ArrayBufferBase,pSVar1->ByteOffset,pSVar1->Length,
                          javascriptLibrary);
    break;
  case TypeIds_BoolArray:
    local_40 = Js::TypedArray<bool,_false,_false>::Create
                         (&arrayBuffer_00->super_ArrayBufferBase,pSVar1->ByteOffset,pSVar1->Length,
                          javascriptLibrary);
    break;
  default:
    TTDAbort_unrecoverable_error("Not a typed array!");
  }
  pRVar2 = Js::VarTo<Js::RecyclableObject>(local_40);
  return pRVar2;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapTypedArrayInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            //I am lazy and always re-create typed arrays.
            //We can re-evaluate this choice later if needed.

            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);
            SnapTypedArrayInfo* typedArrayInfo = SnapObjectGetAddtlInfoAs<SnapTypedArrayInfo*, SnapObjectType::SnapTypedArrayObject>(snpObject);

            Js::JavascriptLibrary* jslib = ctx->GetLibrary();
            Js::ArrayBuffer* arrayBuffer = Js::VarTo<Js::ArrayBuffer>(inflator->LookupObject(typedArrayInfo->ArrayBufferAddr));

            Js::Var tab = nullptr;
            switch(snpObject->SnapType->JsTypeId)
            {
            case Js::TypeIds_Int8Array:
                tab = Js::Int8Array::Create(arrayBuffer, typedArrayInfo->ByteOffset, typedArrayInfo->Length, jslib);
                break;
            case Js::TypeIds_Uint8Array:
                tab = Js::Uint8Array::Create(arrayBuffer, typedArrayInfo->ByteOffset, typedArrayInfo->Length, jslib);
                break;
            case Js::TypeIds_Uint8ClampedArray:
                tab = Js::Uint8ClampedArray::Create(arrayBuffer, typedArrayInfo->ByteOffset, typedArrayInfo->Length, jslib);
                break;
            case Js::TypeIds_Int16Array:
                tab = Js::Int16Array::Create(arrayBuffer, typedArrayInfo->ByteOffset, typedArrayInfo->Length, jslib);
                break;
            case Js::TypeIds_Uint16Array:
                tab = Js::Uint16Array::Create(arrayBuffer, typedArrayInfo->ByteOffset, typedArrayInfo->Length, jslib);
                break;
            case Js::TypeIds_Int32Array:
                tab = Js::Int32Array::Create(arrayBuffer, typedArrayInfo->ByteOffset, typedArrayInfo->Length, jslib);
                break;
            case Js::TypeIds_Uint32Array:
                tab = Js::Uint32Array::Create(arrayBuffer, typedArrayInfo->ByteOffset, typedArrayInfo->Length, jslib);
                break;
            case Js::TypeIds_Float32Array:
                tab = Js::Float32Array::Create(arrayBuffer, typedArrayInfo->ByteOffset, typedArrayInfo->Length, jslib);
                break;
            case Js::TypeIds_Float64Array:
                tab = Js::Float64Array::Create(arrayBuffer, typedArrayInfo->ByteOffset, typedArrayInfo->Length, jslib);
                break;
            case Js::TypeIds_Int64Array:
                tab = Js::Int64Array::Create(arrayBuffer, typedArrayInfo->ByteOffset, typedArrayInfo->Length, jslib);
                break;
            case Js::TypeIds_Uint64Array:
                tab = Js::Uint64Array::Create(arrayBuffer, typedArrayInfo->ByteOffset, typedArrayInfo->Length, jslib);
                break;
            case Js::TypeIds_BoolArray:
                tab = Js::BoolArray::Create(arrayBuffer, typedArrayInfo->ByteOffset, typedArrayInfo->Length, jslib);
                break;
            case Js::TypeIds_CharArray:
                tab = Js::CharArray::Create(arrayBuffer, typedArrayInfo->ByteOffset, typedArrayInfo->Length, jslib);
                break;
            default:
                TTDAssert(false, "Not a typed array!");
                break;
            }

            return Js::VarTo<Js::RecyclableObject>(tab);
        }